

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_archiver.cpp
# Opt level: O0

void __thiscall HuffmanArchiver::zip(HuffmanArchiver *this,istream *cin,ostream *cout)

{
  bool bVar1;
  size_type sVar2;
  reference ppVar3;
  long *plVar4;
  mapped_type *this_00;
  size_type sVar5;
  _Bit_type *in_RCX;
  ostream *in_RDX;
  char *in_RSI;
  int *in_RDI;
  iterator iVar6;
  reference rVar7;
  bool bit_1;
  iterator __end2_1;
  iterator __begin2_1;
  mapped_type *__range2_1;
  char c;
  bool bit;
  iterator __end2;
  iterator __begin2;
  vector<bool,_std::allocator<bool>_> *__range2;
  pair<const_char,_std::vector<bool,_std::allocator<bool>_>_> *i;
  iterator __end1;
  iterator __begin1;
  unordered_map<char,_std::vector<bool,_std::allocator<bool>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>_>_>
  *__range1;
  BitWriter out;
  int full_code_size;
  unordered_map<char,_std::vector<bool,_std::allocator<bool>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>_>_>
  alphabet;
  vector<bool,_std::allocator<bool>_> full_code;
  HuffTree h_tree;
  _Bit_iterator_base *in_stack_fffffffffffffd68;
  BitWriter *in_stack_fffffffffffffd70;
  istream *in_stack_fffffffffffffd78;
  undefined7 in_stack_fffffffffffffd80;
  undefined1 in_stack_fffffffffffffd87;
  undefined7 in_stack_fffffffffffffdb0;
  undefined1 in_stack_fffffffffffffdb7;
  reference local_218;
  undefined1 local_201;
  _Bit_type *local_200;
  uint local_1f8;
  _Bit_type *local_1f0;
  uint local_1e8;
  _Bit_type *local_1e0;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  undefined1 local_1b1;
  _Bit_reference local_1b0;
  undefined1 local_199;
  _Bit_type *local_198;
  uint local_190;
  _Bit_type *local_188;
  uint local_180;
  _Bit_type *local_178;
  uint local_170;
  _Bit_type *local_168;
  uint local_160;
  int in_stack_fffffffffffffea4;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffea8;
  HuffTree *in_stack_fffffffffffffef8;
  _Node_iterator_base<std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>,_false>
  local_f8;
  _Node_iterator_base<std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>,_false>
  local_f0;
  undefined1 *local_e8;
  BitWriter local_e0;
  int local_d0;
  unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>
  *in_stack_ffffffffffffff78;
  HuffTree *in_stack_ffffffffffffff80;
  vector<bool,_std::allocator<bool>_> local_50;
  ostream *local_18;
  char *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  count_data((HuffmanArchiver *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
             in_stack_fffffffffffffd78);
  HuffTree::HuffTree(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)0x124ed1);
  std::
  unordered_map<char,_std::vector<bool,_std::allocator<bool>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>_>_>
  ::unordered_map((unordered_map<char,_std::vector<bool,_std::allocator<bool>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>_>_>
                   *)0x124ede);
  HuffTree::get_alphabet(in_stack_fffffffffffffef8);
  std::
  unordered_map<char,_std::vector<bool,_std::allocator<bool>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>_>_>
  ::operator=((unordered_map<char,_std::vector<bool,_std::allocator<bool>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>_>_>
               *)in_stack_fffffffffffffd70,
              (unordered_map<char,_std::vector<bool,_std::allocator<bool>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>_>_>
               *)in_stack_fffffffffffffd68);
  std::
  unordered_map<char,_std::vector<bool,_std::allocator<bool>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>_>_>
  ::~unordered_map((unordered_map<char,_std::vector<bool,_std::allocator<bool>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>_>_>
                    *)0x124f16);
  local_d0 = HuffTree::get_full_code_size
                       ((HuffTree *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  BitWriter::BitWriter(&local_e0,local_18);
  BitWriter::write(&local_e0,*in_RDI,(void *)0x40,(size_t)in_RCX);
  BitWriter::write(&local_e0,local_d0,(void *)0x20,(size_t)in_RCX);
  sVar2 = std::
          unordered_map<char,_std::vector<bool,_std::allocator<bool>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>_>_>
          ::size((unordered_map<char,_std::vector<bool,_std::allocator<bool>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>_>_>
                  *)0x124f8e);
  BitWriter::write(&local_e0,(int)sVar2,(void *)0x10,(size_t)in_RCX);
  local_e8 = &stack0xffffffffffffff78;
  local_f0._M_cur =
       (__node_type *)
       std::
       unordered_map<char,_std::vector<bool,_std::allocator<bool>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>_>_>
       ::begin((unordered_map<char,_std::vector<bool,_std::allocator<bool>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>_>_>
                *)in_stack_fffffffffffffd68);
  local_f8._M_cur =
       (__node_type *)
       std::
       unordered_map<char,_std::vector<bool,_std::allocator<bool>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>_>_>
       ::end((unordered_map<char,_std::vector<bool,_std::allocator<bool>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>_>_>
              *)in_stack_fffffffffffffd68);
  while( true ) {
    bVar1 = std::__detail::operator!=(&local_f0,&local_f8);
    if (!bVar1) break;
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>,_false,_false>
             ::operator*((_Node_iterator<std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>,_false,_false>
                          *)0x125009);
    BitWriter::write(&local_e0,(int)ppVar3->first,(void *)0x8,(size_t)in_RCX);
    std::vector<bool,_std::allocator<bool>_>::vector
              (in_stack_fffffffffffffe30,
               (vector<bool,_std::allocator<bool>_> *)
               CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    get_full_code(in_stack_fffffffffffffea8,in_stack_fffffffffffffea4);
    in_stack_fffffffffffffea8 = &local_50;
    std::vector<bool,_std::allocator<bool>_>::operator=
              ((vector<bool,_std::allocator<bool>_> *)
               CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
               (vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffd78);
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)0x125092);
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)0x12509f);
    iVar6 = std::vector<bool,_std::allocator<bool>_>::begin
                      ((vector<bool,_std::allocator<bool>_> *)0x1250b9);
    local_178 = iVar6.super__Bit_iterator_base._M_p;
    local_170 = iVar6.super__Bit_iterator_base._M_offset;
    local_168 = local_178;
    local_160 = local_170;
    iVar6 = std::vector<bool,_std::allocator<bool>_>::end(in_stack_fffffffffffffea8);
    local_198 = iVar6.super__Bit_iterator_base._M_p;
    local_190 = iVar6.super__Bit_iterator_base._M_offset;
    local_188 = local_198;
    local_180 = local_190;
    while( true ) {
      in_stack_fffffffffffffdb7 =
           std::operator!=((_Bit_iterator_base *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68
                          );
      if (!(bool)in_stack_fffffffffffffdb7) break;
      rVar7 = std::_Bit_iterator::operator*((_Bit_iterator *)0x125155);
      local_1b0._M_mask = rVar7._M_mask;
      in_RCX = rVar7._M_p;
      local_1b0._M_p = in_RCX;
      local_199 = std::_Bit_reference::operator_cast_to_bool(&local_1b0);
      BitWriter::write(&local_e0,(uint)(byte)local_199,(void *)0x1,(size_t)in_RCX);
      std::_Bit_iterator::operator++((_Bit_iterator *)in_stack_fffffffffffffd70);
    }
    std::__detail::
    _Node_iterator<std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>,_false,_false>::
    operator++((_Node_iterator<std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>,_false,_false>
                *)in_stack_fffffffffffffd70);
  }
  sVar2 = std::
          unordered_map<char,_std::vector<bool,_std::allocator<bool>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>_>_>
          ::size((unordered_map<char,_std::vector<bool,_std::allocator<bool>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>_>_>
                  *)0x12523d);
  *(size_type *)(in_RDI + 4) = sVar2 * (long)(local_d0 + 8) + 0x70;
  *(ulong *)(in_RDI + 4) = *(ulong *)(in_RDI + 4) >> 3;
  while( true ) {
    plVar4 = (long *)std::istream::read(local_10,(long)&local_1b1);
    bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar4 + *(long *)(*plVar4 + -0x18)));
    if (!bVar1) break;
    this_00 = std::
              unordered_map<char,_std::vector<bool,_std::allocator<bool>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>_>_>
              ::operator[]((unordered_map<char,_std::vector<bool,_std::allocator<bool>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>_>_>
                            *)in_stack_fffffffffffffd70,(key_type *)in_stack_fffffffffffffd68);
    iVar6 = std::vector<bool,_std::allocator<bool>_>::begin
                      ((vector<bool,_std::allocator<bool>_> *)0x1252ec);
    local_1e0 = iVar6.super__Bit_iterator_base._M_p;
    iVar6 = std::vector<bool,_std::allocator<bool>_>::end(this_00);
    local_200 = iVar6.super__Bit_iterator_base._M_p;
    local_1f8 = iVar6.super__Bit_iterator_base._M_offset;
    local_1f0 = local_200;
    local_1e8 = local_1f8;
    while( true ) {
      bVar1 = std::operator!=((_Bit_iterator_base *)in_stack_fffffffffffffd70,
                              in_stack_fffffffffffffd68);
      if (!bVar1) break;
      rVar7 = std::_Bit_iterator::operator*((_Bit_iterator *)0x125385);
      local_218 = rVar7;
      local_201 = std::_Bit_reference::operator_cast_to_bool(&local_218);
      in_stack_fffffffffffffd70 = (BitWriter *)rVar7._M_mask;
      BitWriter::write(&local_e0,(uint)(byte)local_201,(void *)0x1,(size_t)rVar7._M_p);
      std::_Bit_iterator::operator++((_Bit_iterator *)in_stack_fffffffffffffd70);
    }
    in_stack_fffffffffffffd68 =
         (_Bit_iterator_base *)
         std::
         unordered_map<char,_std::vector<bool,_std::allocator<bool>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>_>_>
         ::operator[]((unordered_map<char,_std::vector<bool,_std::allocator<bool>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>_>_>
                       *)in_stack_fffffffffffffd70,(key_type *)in_stack_fffffffffffffd68);
    sVar5 = std::vector<bool,_std::allocator<bool>_>::size
                      ((vector<bool,_std::allocator<bool>_> *)
                       CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0));
    *(size_type *)(in_RDI + 2) = sVar5 + *(long *)(in_RDI + 2);
  }
  *(ulong *)(in_RDI + 2) = *(long *)(in_RDI + 2) + 7U >> 3;
  BitWriter::~BitWriter(in_stack_fffffffffffffd70);
  std::
  unordered_map<char,_std::vector<bool,_std::allocator<bool>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>_>_>
  ::~unordered_map((unordered_map<char,_std::vector<bool,_std::allocator<bool>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>_>_>
                    *)0x12545c);
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)0x125469)
  ;
  HuffTree::~HuffTree((HuffTree *)0x125476);
  return;
}

Assistant:

void HuffmanArchiver::zip(std::istream &cin, std::ostream &cout) {
    count_data(cin);
    HuffTree h_tree(_data);
    std::vector<bool> full_code;

    std::unordered_map<char, std::vector<bool>> alphabet;
    alphabet = h_tree.get_alphabet();
    int full_code_size = h_tree.get_full_code_size();

    BitWriter out(cout);

    out.write(static_cast<int>(num_of_symbols_in), BITS_IN_SIZE_T);
    out.write(full_code_size, BITS_IN_INT);
    out.write(static_cast<int>(alphabet.size()), ALPHABET_SIZE);
    for (const auto &i : alphabet) {
        out.write(i.first, BITS_IN_BYTE);
        full_code = get_full_code(i.second, full_code_size);
        for (bool bit : full_code) {
            out.write(bit, 1);
        }
    }

    used_additional_bytes = BITS_IN_SIZE_T + ALPHABET_SIZE + alphabet.size() * (BITS_IN_BYTE + full_code_size)
                            + BITS_IN_INT;
    used_additional_bytes /= BITS_IN_BYTE;

    char c;
    while (cin.read(&c, 1)) {
        for (bool bit : alphabet[c]) {
            out.write(bit, 1);
        }
        num_of_symbols_out += alphabet[c].size();
    }
    num_of_symbols_out = (num_of_symbols_out + 7) / 8;
}